

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall QGraphicsItem::setCursor(QGraphicsItem *this,QCursor *cursor)

{
  undefined1 *puVar1;
  uint *puVar2;
  QGraphicsItemPrivate *pQVar3;
  ulong uVar4;
  QGraphicsScene *pQVar5;
  QWidget *this_00;
  undefined8 uVar6;
  bool bVar7;
  char cVar8;
  QMetaType QVar9;
  pointer pEVar10;
  QWidget *this_01;
  ulong uVar11;
  ExtraStruct *pEVar12;
  long lVar13;
  anon_union_24_3_e3d07ef4_for_data *paVar14;
  long lVar15;
  long in_FS_OFFSET;
  QPointF QVar16;
  QCursor t;
  undefined1 local_100 [16];
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  qreal local_e0;
  qreal local_d8;
  QPoint local_d0;
  QVariant local_c8;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 *puStack_70;
  undefined1 local_68 [8];
  undefined1 local_60 [16];
  char *local_50;
  QMetaTypeInterface *local_48;
  InterfaceType *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar14 = &local_88;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)local_68,(QMetaType)0x7e7f60,cursor);
  (*this->_vptr_QGraphicsItem[0x21])(paVar14,this,0x11);
  ::QVariant::~QVariant((QVariant *)local_68);
  pQVar3 = (this->d_ptr).d;
  local_68 = (undefined1  [8])&QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
  local_a8.shared = (PrivateShared *)((ulong)puStack_70 & 0xfffffffffffffffc);
  bVar7 = comparesEqual((QMetaType *)&local_a8.shared,(QMetaType *)local_68);
  if (bVar7) {
    if (((ulong)puStack_70 & 1) == 0) {
      paVar14 = &local_88;
    }
    else {
      paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_88.shared + *(int *)(local_88.shared + 4));
    }
    QCursor::QCursor((QCursor *)(local_100 + 8),(QCursor *)&paVar14->shared);
  }
  else {
    local_100._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor((QCursor *)(local_100 + 8));
    QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if (((ulong)puStack_70 & 1) != 0) {
      paVar14 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_88.shared + *(int *)(local_88.shared + 4));
    }
    QMetaType::convert(QVar9,paVar14,(QMetaType)local_68,local_100 + 8);
  }
  QCursor::operator_cast_to_QVariant((QVariant *)&local_a8,(QCursor *)(local_100 + 8));
  uVar4 = (pQVar3->extras).d.size;
  if (uVar4 != 0) {
    pEVar12 = (pQVar3->extras).d.ptr;
    uVar11 = 0;
    do {
      if (pEVar12->type == ExtraCursor) {
        pEVar10 = QList<QGraphicsItemPrivate::ExtraStruct>::data(&pQVar3->extras);
        ::QVariant::operator=(&pEVar10[uVar11 & 0xffffffff].value,(QVariant *)&local_a8);
        goto LAB_005db4e1;
      }
      uVar11 = uVar11 + 1;
      pEVar12 = pEVar12 + 1;
    } while (uVar4 != uVar11);
  }
  local_68._0_4_ = 1;
  ::QVariant::QVariant((QVariant *)local_60,(QVariant *)&local_a8);
  QtPrivate::QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct>::
  emplace<QGraphicsItemPrivate::ExtraStruct>
            ((QMovableArrayOps<QGraphicsItemPrivate::ExtraStruct> *)&pQVar3->extras,
             (pQVar3->extras).d.size,(ExtraStruct *)local_68);
  QList<QGraphicsItemPrivate::ExtraStruct>::end(&pQVar3->extras);
  ::QVariant::~QVariant((QVariant *)local_60);
LAB_005db4e1:
  ::QVariant::~QVariant((QVariant *)&local_a8);
  QCursor::~QCursor((QCursor *)(local_100 + 8));
  puVar1 = &((this->d_ptr).d)->field_0x160;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000;
  pQVar5 = ((this->d_ptr).d)->scene;
  if (pQVar5 == (QGraphicsScene *)0x0) goto LAB_005db730;
  puVar2 = (uint *)(*(long *)&pQVar5->field_0x8 + 0xb8);
  *puVar2 = *puVar2 & 0xffffdfff;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsScene::views
            ((QList<QGraphicsView_*> *)&local_a8,(QGraphicsScene *)((this->d_ptr).d)->scene);
  uVar6 = local_a8._8_8_;
  if ((undefined1 *)local_a8._16_8_ != (undefined1 *)0x0) {
    lVar15 = local_a8._16_8_ << 3;
    lVar13 = 0;
    do {
      this_00 = *(QWidget **)(uVar6 + lVar13);
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this_00);
      QWidget::setAttribute(this_01,WA_MouseTracking,true);
      if ((this_00->data->widget_attributes & 2) != 0) {
        local_68 = (undefined1  [8])QCursor::pos();
        local_d0 = QWidget::mapFromGlobal(this_00,(QPoint *)local_68);
        QVar16 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_d0);
        local_60._0_8_ = QVar16.yp;
        local_68 = (undefined1  [8])QVar16.xp;
        QVar16 = mapFromScene(this,(QPointF *)local_68);
        local_d8 = QVar16.yp;
        local_e0 = QVar16.xp;
        (*this->_vptr_QGraphicsItem[3])((QPointF *)local_68,this);
        cVar8 = QRectF::contains((QPointF *)local_68);
        if (cVar8 != '\0') {
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          local_100._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
          QGraphicsView::items
                    ((QList<QGraphicsItem_*> *)(local_100 + 8),(QGraphicsView *)this_00,&local_d0);
          if (local_e8 == (undefined1 *)0x0) goto LAB_005db6ea;
          lVar13 = 0;
          goto LAB_005db667;
        }
        break;
      }
      lVar13 = lVar13 + 8;
    } while (lVar15 != lVar13);
  }
  goto LAB_005db70d;
  while (lVar13 = lVar13 + 8, (long)local_e8 << 3 != lVar13) {
LAB_005db667:
    if ((*(byte *)(*(long *)(*(long *)(puStack_f0 + lVar13) + 8) + 0x161) & 0x80) != 0) {
      QGraphicsItem::cursor((QGraphicsItem *)local_100);
      local_68 = (undefined1  [8])0x0;
      local_60._8_8_ = 0;
      local_50 = "QCursor";
      local_48 = (QMetaTypeInterface *)0x0;
      local_40 = &QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
      local_60._0_8_ = (QGraphicsItem *)local_100;
      QMetaObject::invokeMethodImpl
                (&this_00->super_QObject,"_q_setViewportCursor",AutoConnection,2,(void **)local_68,
                 (char **)(local_60 + 8),&local_48);
      QCursor::~QCursor((QCursor *)local_100);
      break;
    }
  }
LAB_005db6ea:
  if ((QGraphicsItemPrivate *)local_100._8_8_ != (QGraphicsItemPrivate *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_100._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_100._8_8_,8,0x10);
    }
  }
LAB_005db70d:
  if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    UNLOCK();
    if (*(int *)local_a8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_a8.shared,8,0x10);
    }
  }
LAB_005db730:
  (*this->_vptr_QGraphicsItem[0x21])(&local_c8,this,0x12,&local_88);
  ::QVariant::~QVariant(&local_c8);
  ::QVariant::~QVariant((QVariant *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setCursor(const QCursor &cursor)
{
    const QVariant cursorVariant(itemChange(ItemCursorChange, QVariant::fromValue<QCursor>(cursor)));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraCursor, qvariant_cast<QCursor>(cursorVariant));
    d_ptr->hasCursor = 1;
    if (d_ptr->scene) {
        d_ptr->scene->d_func()->allItemsUseDefaultCursor = false;
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            view->viewport()->setMouseTracking(true);
            // Note: Some of this logic is duplicated in QGraphicsView's mouse events.
            if (view->underMouse()) {
                const QPoint viewPoint = view->mapFromGlobal(QCursor::pos());
                const QPointF cursorPos = mapFromScene(view->mapToScene(viewPoint));
                // the cursor can only change if the current item is under the mouse
                if (boundingRect().contains(cursorPos)) {
                    const auto itemsUnderCursor = view->items(viewPoint);
                    for (QGraphicsItem *itemUnderCursor : itemsUnderCursor) {
                        if (itemUnderCursor->hasCursor()) {
                            QMetaObject::invokeMethod(view, "_q_setViewportCursor",
                                                      Q_ARG(QCursor, itemUnderCursor->cursor()));
                            break;
                        }
                    }
                }
                break;
            }
        }
    }
    itemChange(ItemCursorHasChanged, cursorVariant);
}